

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring_bitmap_t * roaring_bitmap_frozen_view(char *buf,size_t length)

{
  uint8_t uVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  char *res;
  roaring_bitmap_t *prVar6;
  void *pvVar7;
  int iVar8;
  char *pcVar9;
  uint uVar10;
  int iVar12;
  void *__ptr;
  uint uVar13;
  long lVar14;
  int32_t i;
  ulong uVar15;
  long lVar16;
  char *pcVar17;
  long lVar18;
  char *pcVar19;
  uint8_t *puVar20;
  ulong uVar11;
  
  if ((3 < length && ((ulong)buf & 0x1f) == 0) &&
     ((*(uint *)(buf + (length - 4)) & 0x7fff) == 0x35c6)) {
    uVar10 = *(uint *)(buf + (length - 4)) >> 0xf;
    uVar11 = (ulong)uVar10;
    iVar5 = 0;
    if (length < uVar11 * 5 + 4) {
      return (roaring_bitmap_t *)0x0;
    }
    lVar3 = length - 4;
    lVar4 = lVar3 - (ulong)(uVar10 * 3);
    puVar20 = (uint8_t *)(buf + (lVar3 - uVar11));
    lVar16 = 0;
    lVar18 = 0;
    lVar14 = 0;
    iVar8 = 0;
    iVar12 = 0;
    for (uVar15 = 0; uVar11 != uVar15; uVar15 = uVar15 + 1) {
      uVar1 = puVar20[uVar15];
      if (uVar1 == '\x03') {
        iVar8 = iVar8 + 1;
        lVar18 = lVar18 + (ulong)*(ushort *)(buf + uVar15 * 2 + lVar4) * 4;
      }
      else if (uVar1 == '\x02') {
        iVar5 = iVar5 + 1;
        lVar14 = lVar14 + (ulong)*(ushort *)(buf + uVar15 * 2 + lVar4) * 2 + 2;
      }
      else {
        if (uVar1 != '\x01') {
          return (roaring_bitmap_t *)0x0;
        }
        iVar12 = iVar12 + 1;
        lVar16 = lVar16 + 0x2000;
      }
    }
    if ((ulong)(uVar10 * 5) + lVar16 + lVar18 + lVar14 + 4 == length) {
      uVar11 = (ulong)(uVar10 * 8);
      prVar6 = (roaring_bitmap_t *)
               malloc(uVar11 + ((long)iVar5 + (long)iVar8 + (long)iVar12) * 0x10 + 0x28);
      if (prVar6 != (roaring_bitmap_t *)0x0) {
        pcVar17 = buf + lVar16;
        pcVar19 = pcVar17 + lVar18;
        (prVar6->high_low_container).flags = '\x02';
        (prVar6->high_low_container).allocation_size = uVar10;
        (prVar6->high_low_container).size = uVar10;
        (prVar6->high_low_container).keys = (uint16_t *)(buf + (lVar3 - (ulong)(uVar10 * 5)));
        (prVar6->high_low_container).typecodes = puVar20;
        pvVar7 = (void *)((long)&prVar6[1].high_low_container.size + uVar11);
        (prVar6->high_low_container).containers = (void **)(prVar6 + 1);
        uVar15 = 0;
        pcVar9 = buf;
        __ptr = pvVar7;
        do {
          if (uVar10 * 2 == uVar15) {
            return prVar6;
          }
          uVar1 = *puVar20;
          if (uVar1 == '\x03') {
            uVar2 = *(ushort *)(buf + uVar15 + lVar4);
            *(uint *)((long)&prVar6[1].high_low_container.allocation_size + uVar15 * 8 + uVar11) =
                 (uint)uVar2;
            *(uint *)((long)pvVar7 + uVar15 * 8) = (uint)uVar2;
            *(char **)((long)&prVar6[1].high_low_container.containers + uVar15 * 8 + uVar11) =
                 pcVar17;
            *(void **)((long)(prVar6->high_low_container).containers + uVar15 * 4) = __ptr;
            pcVar17 = pcVar17 + (ulong)uVar2 * 4;
          }
          else if (uVar1 == '\x02') {
            uVar13 = *(ushort *)(buf + uVar15 + lVar4) + 1;
            *(uint *)((long)&prVar6[1].high_low_container.allocation_size + uVar15 * 8 + uVar11) =
                 uVar13;
            *(uint *)((long)pvVar7 + uVar15 * 8) = uVar13;
            *(char **)((long)&prVar6[1].high_low_container.containers + uVar15 * 8 + uVar11) =
                 pcVar19;
            *(void **)((long)(prVar6->high_low_container).containers + uVar15 * 4) = __ptr;
            pcVar19 = pcVar19 + (ulong)uVar13 * 2;
          }
          else {
            if (uVar1 != '\x01') {
              free(__ptr);
              return (roaring_bitmap_t *)0x0;
            }
            *(char **)((long)&prVar6[1].high_low_container.containers + uVar15 * 8 + uVar11) =
                 pcVar9;
            *(uint *)((long)pvVar7 + uVar15 * 8) = *(ushort *)(buf + uVar15 + lVar4) + 1;
            *(void **)((long)(prVar6->high_low_container).containers + uVar15 * 4) = __ptr;
            pcVar9 = pcVar9 + 0x2000;
          }
          __ptr = (void *)((long)__ptr + 0x10);
          uVar15 = uVar15 + 2;
          puVar20 = puVar20 + 1;
        } while( true );
      }
    }
  }
  return (roaring_bitmap_t *)0x0;
}

Assistant:

const roaring_bitmap_t *
roaring_bitmap_frozen_view(const char *buf, size_t length) {
    if ((uintptr_t)buf % 32 != 0) {
        return NULL;
    }

    // cookie and num_containers
    if (length < 4) {
        return NULL;
    }
    uint32_t header;
    memcpy(&header, buf + length - 4, 4); // header may be misaligned
    if ((header & 0x7FFF) != FROZEN_COOKIE) {
        return NULL;
    }
    int32_t num_containers = (header >> 15);

    // typecodes, counts and keys
    if (length < 4 + (size_t)num_containers * (1 + 2 + 2)) {
        return NULL;
    }
    uint16_t *keys = (uint16_t *)(buf + length - 4 - num_containers * 5);
    uint16_t *counts = (uint16_t *)(buf + length - 4 - num_containers * 3);
    uint8_t *typecodes = (uint8_t *)(buf + length - 4 - num_containers * 1);

    // {bitset,array,run}_zone
    int32_t num_bitset_containers = 0;
    int32_t num_run_containers = 0;
    int32_t num_array_containers = 0;
    size_t bitset_zone_size = 0;
    size_t run_zone_size = 0;
    size_t array_zone_size = 0;
    for (int32_t i = 0; i < num_containers; i++) {
        switch (typecodes[i]) {
            case BITSET_CONTAINER_TYPE:
                num_bitset_containers++;
                bitset_zone_size += BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
                break;
            case RUN_CONTAINER_TYPE:
                num_run_containers++;
                run_zone_size += counts[i] * sizeof(rle16_t);
                break;
            case ARRAY_CONTAINER_TYPE:
                num_array_containers++;
                array_zone_size += (counts[i] + UINT32_C(1)) * sizeof(uint16_t);
                break;
            default:
                return NULL;
        }
    }
    if (length != bitset_zone_size + run_zone_size + array_zone_size +
                  5 * num_containers + 4) {
        return NULL;
    }
    uint64_t *bitset_zone = (uint64_t*) (buf);
    rle16_t *run_zone = (rle16_t*) (buf + bitset_zone_size);
    uint16_t *array_zone = (uint16_t*) (buf + bitset_zone_size + run_zone_size);

    size_t alloc_size = 0;
    alloc_size += sizeof(roaring_bitmap_t);
    alloc_size += num_containers * sizeof(container_t*);
    alloc_size += num_bitset_containers * sizeof(bitset_container_t);
    alloc_size += num_run_containers * sizeof(run_container_t);
    alloc_size += num_array_containers * sizeof(array_container_t);

    char *arena = (char *)malloc(alloc_size);
    if (arena == NULL) {
        return NULL;
    }

    roaring_bitmap_t *rb = (roaring_bitmap_t *)
            arena_alloc(&arena, sizeof(roaring_bitmap_t));
    rb->high_low_container.flags = ROARING_FLAG_FROZEN;
    rb->high_low_container.allocation_size = num_containers;
    rb->high_low_container.size = num_containers;
    rb->high_low_container.keys = (uint16_t *)keys;
    rb->high_low_container.typecodes = (uint8_t *)typecodes;
    rb->high_low_container.containers =
        (container_t **)arena_alloc(&arena,
                                    sizeof(container_t*) * num_containers);
    for (int32_t i = 0; i < num_containers; i++) {
        switch (typecodes[i]) {
            case BITSET_CONTAINER_TYPE: {
                bitset_container_t *bitset = (bitset_container_t *)
                        arena_alloc(&arena, sizeof(bitset_container_t));
                bitset->words = bitset_zone;
                bitset->cardinality = counts[i] + UINT32_C(1);
                rb->high_low_container.containers[i] = bitset;
                bitset_zone += BITSET_CONTAINER_SIZE_IN_WORDS;
                break;
            }
            case RUN_CONTAINER_TYPE: {
                run_container_t *run = (run_container_t *)
                        arena_alloc(&arena, sizeof(run_container_t));
                run->capacity = counts[i];
                run->n_runs = counts[i];
                run->runs = run_zone;
                rb->high_low_container.containers[i] = run;
                run_zone += run->n_runs;
                break;
            }
            case ARRAY_CONTAINER_TYPE: {
                array_container_t *array = (array_container_t *)
                        arena_alloc(&arena, sizeof(array_container_t));
                array->capacity = counts[i] + UINT32_C(1);
                array->cardinality = counts[i] + UINT32_C(1);
                array->array = array_zone;
                rb->high_low_container.containers[i] = array;
                array_zone += counts[i] + UINT32_C(1);
                break;
            }
            default:
                free(arena);
                return NULL;
        }
    }

    return rb;
}